

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statement.cpp
# Opt level: O0

void __thiscall cs::statement_throw::run_impl(statement_throw *this)

{
  bool bVar1;
  undefined8 uVar2;
  lang_error *this_00;
  var e;
  undefined1 in_stack_000008af;
  iterator *in_stack_000008b0;
  runtime_type *in_stack_000008b8;
  type_info *in_stack_ffffffffffffff68;
  runtime_error *in_stack_ffffffffffffff70;
  allocator local_49;
  string local_48 [48];
  tree_node *local_18;
  any *in_stack_fffffffffffffff0;
  
  std::__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x2db105);
  std::__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x2db111);
  local_18 = (tree_node *)
             tree_type<cs::token_base_*>::root
                       ((tree_type<cs::token_base_*> *)in_stack_ffffffffffffff68);
  runtime_type::parse_expr(in_stack_000008b8,in_stack_000008b0,(bool)in_stack_000008af);
  cs_impl::any::type((any *)in_stack_ffffffffffffff70);
  bVar1 = std::type_info::operator!=
                    ((type_info *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  if (!bVar1) {
    this_00 = (lang_error *)__cxa_allocate_exception(0x20);
    cs_impl::any::const_val<cs::lang_error>(in_stack_fffffffffffffff0);
    lang_error::lang_error(this_00,(lang_error *)in_stack_ffffffffffffff68);
    __cxa_throw(this_00,&lang_error::typeinfo,lang_error::~lang_error);
  }
  uVar2 = __cxa_allocate_exception(0x28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_48,"Throwing unsupported exception.",&local_49);
  runtime_error::runtime_error(in_stack_ffffffffffffff70,(string *)in_stack_ffffffffffffff68);
  __cxa_throw(uVar2,&runtime_error::typeinfo,runtime_error::~runtime_error);
}

Assistant:

void statement_throw::run_impl()
	{
		CS_DEBUGGER_STEP(this);
		var e = context->instance->parse_expr(this->mTree.root());
		if (e.type() != typeid(lang_error))
			throw runtime_error("Throwing unsupported exception.");
		else
			throw e.const_val<lang_error>();
	}